

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void arimatest(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar2;
  arima_object obj;
  undefined1 *puVar3;
  uint N;
  long lVar4;
  double dVar5;
  undefined1 local_4b48 [8];
  double temp2 [1200];
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e6.dat","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    N = 0;
    if (iVar1 == 0) {
      pdVar2 = temp2 + 0x4af;
      puVar3 = local_4b48;
      N = 0;
      do {
        __isoc99_fscanf(__stream,"%lf %lf \n",pdVar2,puVar3);
        iVar1 = feof(__stream);
        puVar3 = puVar3 + 8;
        pdVar2 = pdVar2 + 1;
        N = N + 1;
      } while (iVar1 == 0);
    }
    pdVar2 = (double *)malloc((ulong)N * 8);
    if (N != 0) {
      memcpy(pdVar2,temp2 + 0x4af,(ulong)N << 3);
    }
    lVar4 = 0;
    obj = arima_init(1,0,1,N);
    arima_setMethod(obj,0);
    arima_setOptMethod(obj,7);
    arima_exec(obj,pdVar2);
    arima_summary(obj);
    arima_predict(obj,pdVar2,5,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",xpred[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    lVar4 = 0;
    printf("Standard Errors  : ");
    do {
      dVar5 = amse[lVar4];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    arima_free(obj);
    free(pdVar2);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void arimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	double *phi, *theta;
	double *xpred, *amse;
	arima_object obj;
	p = 1;
	d = 0;
	q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/e6.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf \n", &temp[i],&temp2[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = arima_init(p, d, q, N);
	arima_setMethod(obj, 0); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	arima_setOptMethod(obj, 7);// Method 7 ("BFGS with More Thuente Line search") is default so this step is unnecessary. The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	arima_exec(obj, inp);
	arima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	arima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	arima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(xpred);
	free(amse);
}